

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::Double(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
         *this,double d)

{
  Stack<rapidjson::CrtAllocator> *this_00;
  char *pcVar1;
  bool bVar2;
  double dVar3;
  char *pcVar4;
  ulong uVar5;
  double value;
  int length;
  int K;
  int local_4c;
  double local_48;
  int local_34;
  
  local_48 = d;
  Prefix(this,kNumberType);
  dVar3 = local_48;
  uVar5 = (ulong)local_48 & 0x7ff0000000000000;
  if (uVar5 != 0x7ff0000000000000) {
    this_00 = &this->os_->stack_;
    if ((long)this_00->stackEnd_ - (long)this_00->stackTop_ < 0x19) {
      internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,0x19);
    }
    value = local_48;
    pcVar1 = this_00->stackTop_;
    this_00->stackTop_ = pcVar1 + 0x19;
    bVar2 = local_48 < 0.0;
    if (local_48 == 0.0) {
      pcVar4 = pcVar1;
      if ((long)dVar3 < 0) {
        pcVar4 = pcVar1 + 1;
        *pcVar1 = '-';
      }
      pcVar4[0] = '0';
      pcVar4[1] = '.';
      pcVar4[2] = '0';
      pcVar4 = pcVar4 + 3;
    }
    else {
      local_48 = (double)CONCAT44(local_48._4_4_,this->maxDecimalPlaces_);
      pcVar4 = pcVar1;
      if (bVar2) {
        *pcVar1 = '-';
        value = -value;
        pcVar4 = pcVar1 + 1;
      }
      internal::Grisu2(value,pcVar4,&local_4c,&local_34);
      pcVar4 = internal::Prettify(pcVar4,local_4c,local_34,local_48._0_4_);
    }
    (this->os_->stack_).stackTop_ =
         pcVar4 + (long)((this->os_->stack_).stackTop_ + (-0x19 - (long)pcVar1));
  }
  return uVar5 != 0x7ff0000000000000;
}

Assistant:

bool Double(double d)       { Prefix(kNumberType); return EndValue(WriteDouble(d)); }